

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O1

bool __thiscall QGroupBox::event(QGroupBox *this,QEvent *e)

{
  ushort uVar1;
  SubControl SVar2;
  QGroupBoxPrivate *this_00;
  QRect QVar3;
  QRect QVar4;
  QRect QVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined4 uVar9;
  uint uVar10;
  int iVar11;
  QStyle *pQVar12;
  ulong uVar13;
  QKeyEvent *k;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar14 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar15 [16];
  QStyleOptionGroupBox box;
  QRect local_e8;
  QRect local_d8;
  undefined1 local_c8 [16];
  QStyleOptionGroupBox local_b8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGroupBoxPrivate **)&(this->super_QWidget).field_0x8;
  if ((*(short *)(e + 8) == 0x75) && (*(int *)(e + 0x18) == this_00->shortcutId)) {
    if (this_00->checkable == false) {
      QGroupBoxPrivate::_q_fixFocus(this_00,ShortcutFocusReason);
    }
    else {
      QGroupBoxPrivate::click(this_00);
      QWidget::setFocus(&this->super_QWidget,ShortcutFocusReason);
    }
    bVar8 = true;
    goto LAB_00412d35;
  }
  memset(&local_b8,0xaa,0x88);
  QStyleOptionGroupBox::QStyleOptionGroupBox(&local_b8);
  (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&local_b8);
  QVar5.x2.m_i = local_c8._8_4_;
  QVar5.y2.m_i = local_c8._12_4_;
  QVar5.x1.m_i = local_c8._0_4_;
  QVar5.y1.m_i = local_c8._4_4_;
  QVar4.x2.m_i = local_d8.x2.m_i;
  QVar4.y2.m_i = local_d8.y2.m_i;
  QVar4.x1.m_i = local_d8.x1.m_i;
  QVar4.y1.m_i = local_d8.y1.m_i;
  QVar3.x2.m_i = local_e8.x2.m_i;
  QVar3.y2.m_i = local_e8.y2.m_i;
  QVar3.x1.m_i = local_e8.x1.m_i;
  QVar3.y1.m_i = local_e8.y1.m_i;
  uVar1 = *(ushort *)(e + 8);
  if (uVar1 < 0x7f) {
    if (uVar1 == 6) {
      bVar8 = QGroupBoxPrivate::shouldHandleKeyEvent(this_00,(QKeyEvent *)e);
      if (!bVar8) goto LAB_00412ce3;
      this_00->pressedControl = SC_ComboBoxFrame;
      pQVar12 = QWidget::style(&this->super_QWidget);
      local_c8 = (**(code **)(*(long *)pQVar12 + 0xd8))(pQVar12,7,&local_b8,1,this);
      QWidget::update(&this->super_QWidget,(QRect *)local_c8);
      QVar4.x2.m_i = local_d8.x2.m_i;
      QVar4.y2.m_i = local_d8.y2.m_i;
      QVar4.x1.m_i = local_d8.x1.m_i;
      QVar4.y1.m_i = local_d8.y1.m_i;
      QVar3.x2.m_i = local_e8.x2.m_i;
      QVar3.y2.m_i = local_e8.y2.m_i;
      QVar3.x1.m_i = local_e8.x1.m_i;
      QVar3.y1.m_i = local_e8.y1.m_i;
      bVar8 = true;
      QVar5 = (QRect)local_c8;
    }
    else {
      if ((uVar1 == 7) &&
         (bVar7 = QGroupBoxPrivate::shouldHandleKeyEvent(this_00,(QKeyEvent *)e), bVar7)) {
        SVar2 = this_00->pressedControl;
        this_00->pressedControl = SC_None;
        if (SVar2 - SC_ComboBoxFrame < 2) {
          QGroupBoxPrivate::click(this_00);
        }
        QVar5.x2.m_i = local_c8._8_4_;
        QVar5.y2.m_i = local_c8._12_4_;
        QVar5.x1.m_i = local_c8._0_4_;
        QVar5.y1.m_i = local_c8._4_4_;
        QVar4.x2.m_i = local_d8.x2.m_i;
        QVar4.y2.m_i = local_d8.y2.m_i;
        QVar4.x1.m_i = local_d8.x1.m_i;
        QVar4.y1.m_i = local_d8.y1.m_i;
        QVar3.x2.m_i = local_e8.x2.m_i;
        QVar3.y2.m_i = local_e8.y2.m_i;
        QVar3.x1.m_i = local_e8.x1.m_i;
        QVar3.y1.m_i = local_e8.y1.m_i;
        bVar8 = true;
        if (bVar7) goto LAB_00412cf0;
      }
LAB_00412ce3:
      bVar8 = QWidget::event(&this->super_QWidget,e);
      QVar5.x2.m_i = local_c8._8_4_;
      QVar5.y2.m_i = local_c8._12_4_;
      QVar5.x1.m_i = local_c8._0_4_;
      QVar5.y1.m_i = local_c8._4_4_;
      QVar4.x2.m_i = local_d8.x2.m_i;
      QVar4.y2.m_i = local_d8.y2.m_i;
      QVar4.x1.m_i = local_d8.x1.m_i;
      QVar4.y1.m_i = local_d8.y1.m_i;
      QVar3.x2.m_i = local_e8.x2.m_i;
      QVar3.y2.m_i = local_e8.y2.m_i;
      QVar3.x1.m_i = local_e8.x1.m_i;
      QVar3.y1.m_i = local_e8.y1.m_i;
    }
  }
  else {
    if (uVar1 == 0x81) {
LAB_00412abb:
      pQVar12 = QWidget::style(&this->super_QWidget);
      uVar9 = QEventPoint::position();
      auVar15._0_8_ =
           (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM1_Qa;
      auVar15._8_8_ =
           (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM0_Qa;
      auVar15 = minpd(_DAT_0066f5d0,auVar15);
      auVar14._8_8_ = -(ulong)(-2147483648.0 < auVar15._8_8_);
      auVar14._0_8_ = -(ulong)(-2147483648.0 < auVar15._0_8_);
      uVar10 = movmskpd(uVar9,auVar14);
      uVar13 = 0x8000000000000000;
      if ((uVar10 & 1) != 0) {
        uVar13 = (ulong)(uint)(int)auVar15._0_8_ << 0x20;
      }
      local_c8._0_8_ = 0x80000000;
      if ((uVar10 & 2) != 0) {
        local_c8._0_8_ = (ulong)(uint)(int)auVar15._8_8_;
      }
      local_c8._0_8_ = local_c8._0_8_ | uVar13;
      iVar11 = (**(code **)(*(long *)pQVar12 + 0xd0))(pQVar12,7,&local_b8,local_c8,this);
      QVar5.x2.m_i = local_c8._8_4_;
      QVar5.y2.m_i = local_c8._12_4_;
      QVar5.x1.m_i = local_c8._0_4_;
      QVar5.y1.m_i = local_c8._4_4_;
      QVar4.x2.m_i = local_d8.x2.m_i;
      QVar4.y2.m_i = local_d8.y2.m_i;
      QVar4.x1.m_i = local_d8.x1.m_i;
      QVar4.y1.m_i = local_d8.y1.m_i;
      QVar3.x2.m_i = local_e8.x2.m_i;
      QVar3.y2.m_i = local_e8.y2.m_i;
      QVar3.x1.m_i = local_e8.x1.m_i;
      QVar3.y1.m_i = local_e8.y1.m_i;
      bVar6 = (bool)(iVar11 - 1U < 2 & this_00->checkable);
      bVar7 = this_00->hover;
      this_00->hover = bVar6;
      bVar8 = true;
      if (bVar7 == bVar6) goto LAB_00412cf0;
    }
    else {
      if (uVar1 != 0x80) {
        if (uVar1 != 0x7f) goto LAB_00412ce3;
        goto LAB_00412abb;
      }
      this_00->hover = false;
      bVar8 = true;
      if (this_00->checkable != true) goto LAB_00412cf0;
    }
    bVar8 = true;
    local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar12 = QWidget::style(&this->super_QWidget);
    local_d8 = (QRect)(**(code **)(*(long *)pQVar12 + 0xd8))(pQVar12,7,&local_b8,1,this);
    pQVar12 = QWidget::style(&this->super_QWidget);
    local_e8 = (QRect)(**(code **)(*(long *)pQVar12 + 0xd8))(pQVar12,7,&local_b8,2,this);
    local_c8 = QRect::operator|(&local_d8,&local_e8);
    QWidget::update(&this->super_QWidget,(QRect *)local_c8);
    QVar3 = local_e8;
    QVar4 = local_d8;
    QVar5 = (QRect)local_c8;
  }
LAB_00412cf0:
  local_e8 = QVar3;
  local_d8 = QVar4;
  local_c8 = (undefined1  [16])QVar5;
  if (&(local_b8.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)&local_b8);
LAB_00412d35:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool QGroupBox::event(QEvent *e)
{
    Q_D(QGroupBox);
#ifndef QT_NO_SHORTCUT
    if (e->type() == QEvent::Shortcut) {
        QShortcutEvent *se = static_cast<QShortcutEvent *>(e);
        if (se->shortcutId() == d->shortcutId) {
            if (!isCheckable()) {
                d->_q_fixFocus(Qt::ShortcutFocusReason);
            } else {
                d->click();
                setFocus(Qt::ShortcutFocusReason);
            }
            return true;
        }
    }
#endif
    QStyleOptionGroupBox box;
    initStyleOption(&box);
    switch (e->type()) {
    case QEvent::HoverEnter:
    case QEvent::HoverMove: {
        QStyle::SubControl control = style()->hitTestComplexControl(QStyle::CC_GroupBox, &box,
                                                                    static_cast<QHoverEvent *>(e)->position().toPoint(),
                                                                    this);
        bool oldHover = d->hover;
        d->hover = d->checkable && (control == QStyle::SC_GroupBoxLabel || control == QStyle::SC_GroupBoxCheckBox);
        if (oldHover != d->hover) {
            QRect rect = style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this)
                         | style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxLabel, this);
            update(rect);
        }
        return true;
    }
    case QEvent::HoverLeave:
        d->hover = false;
        if (d->checkable) {
            QRect rect = style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this)
                         | style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxLabel, this);
            update(rect);
        }
        return true;
    case QEvent::KeyPress: {
        QKeyEvent *k = static_cast<QKeyEvent*>(e);
        if (d->shouldHandleKeyEvent(k)) {
            d->pressedControl = QStyle::SC_GroupBoxCheckBox;
            update(style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this));
            return true;
        }
        break;
    }
    case QEvent::KeyRelease: {
        QKeyEvent *k = static_cast<QKeyEvent*>(e);
        if (d->shouldHandleKeyEvent(k)) {
            bool toggle = (d->pressedControl == QStyle::SC_GroupBoxLabel
                           || d->pressedControl == QStyle::SC_GroupBoxCheckBox);
            d->pressedControl = QStyle::SC_None;
            if (toggle)
                d->click();
            return true;
        }
        break;
    }
    default:
        break;
    }
    return QWidget::event(e);
}